

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

bool __thiscall libcellml::Model::doEquals(Model *this,EntityPtr *other)

{
  bool bVar1;
  shared_ptr<libcellml::Model> model;
  shared_ptr<libcellml::Entity> local_28;
  
  bVar1 = ComponentEntity::doEquals(&this->super_ComponentEntity,other);
  if (bVar1) {
    std::dynamic_pointer_cast<libcellml::Model,libcellml::Entity>(&local_28);
    if ((local_28.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       (bVar1 = ModelImpl::equalUnits
                          ((ModelImpl *)
                           (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                           super_Entity.mPimpl,(ModelPtr *)&local_28), bVar1)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_28.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return true;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super___shared_ptr<libcellml::Entity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return false;
}

Assistant:

bool Model::doEquals(const EntityPtr &other) const
{
    if (ComponentEntity::doEquals(other)) {
        auto model = std::dynamic_pointer_cast<Model>(other);
        if ((model != nullptr) && pFunc()->equalUnits(model)) {
            return true;
        }
    }
    return false;
}